

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

IterateResult __thiscall gl3cts::TransformFeedback::DrawXFB::iterate(DrawXFB *this)

{
  ostringstream *poVar1;
  GLenum capture_mode;
  GLuint GVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  ContextType ctxType;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar8;
  byte bVar9;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLfloat *pGVar10;
  ulong uVar11;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x104);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback2");
  if ((bVar3) || (bVar4)) {
    bVar5 = 1;
    lVar8 = 0;
    bVar3 = true;
    do {
      capture_mode = s_capture_modes[lVar8];
      prepare(this,capture_mode);
      GVar2 = this->m_vao_id;
      iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar6) + 0xd8))(GVar2);
      dVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
      glu::checkError(dVar7,"glBindVertexArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1160);
      GVar2 = this->m_program_id_xfb;
      iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x1680))(GVar2);
      dVar7 = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
      glu::checkError(dVar7,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x11a4);
      if (bVar3 != false) {
        pGVar10 = s_colours[0] + 2;
        uVar11 = 0;
        do {
          GVar2 = this->m_xfb_id[uVar11];
          iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0xd0))(0x8e22,GVar2);
          dVar7 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x800))();
          glu::checkError(dVar7,"glBindTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x1157);
          bindBOForXFB(this,capture_mode,this->m_bo_id[uVar11]);
          useColour(this,this->m_program_id_xfb,(*(GLfloat (*) [4])(pGVar10 + -2))[0],pGVar10[-1],
                    *pGVar10,1.0);
          useGeometrySet(this,this->m_program_id_xfb,false);
          drawForCapture(this,true,true,false,false);
          bVar3 = inspectXFBState(this,true,true);
          bVar4 = uVar11 < 2;
          uVar11 = uVar11 + 1;
          pGVar10 = pGVar10 + 4;
        } while (bVar4 && bVar3);
      }
      if (bVar3 != false) {
        pGVar10 = s_colours[0] + 2;
        uVar11 = 0;
        do {
          GVar2 = this->m_xfb_id[uVar11];
          iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0xd0))(0x8e22,GVar2);
          dVar7 = (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x800))();
          glu::checkError(dVar7,"glBindTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x1157);
          useColour(this,this->m_program_id_xfb,(*(GLfloat (*) [4])(pGVar10 + -2))[0],pGVar10[-1],
                    *pGVar10,1.0);
          useGeometrySet(this,this->m_program_id_xfb,true);
          drawForCapture(this,false,false,true,true);
          bVar3 = inspectXFBState(this,false,false);
          bVar4 = uVar11 < 2;
          uVar11 = uVar11 + 1;
          pGVar10 = pGVar10 + 4;
        } while (bVar4 && bVar3);
      }
      GVar2 = this->m_program_id_draw;
      iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x1680))(GVar2);
      dVar7 = (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x800))();
      glu::checkError(dVar7,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x11a4);
      if (bVar3 != false) {
        pGVar10 = s_colours[0] + 2;
        uVar11 = 0;
        do {
          GVar2 = this->m_xfb_id[uVar11];
          iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var_04,iVar6) + 0xd0))(0x8e22,GVar2);
          dVar7 = (**(code **)(CONCAT44(extraout_var_04,iVar6) + 0x800))();
          glu::checkError(dVar7,"glBindTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x1157);
          bindBOForDraw(this,this->m_program_id_draw,capture_mode,this->m_bo_id[uVar11]);
          drawToFramebuffer(this,this->m_xfb_id[uVar11]);
          bVar3 = checkFramebuffer(this,(*(GLfloat (*) [4])(pGVar10 + -2))[0],pGVar10[-1],*pGVar10,
                                   1.0);
          bVar4 = uVar11 < 2;
          uVar11 = uVar11 + 1;
          pGVar10 = pGVar10 + 4;
        } while (bVar4 && bVar3);
      }
      clean(this);
      bVar9 = bVar5 & bVar3;
      lVar8 = 1;
      bVar5 = 0;
    } while (bVar9 != 0);
    if (bVar3 == false) {
      local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Draw XFB have failed.",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00865c2d;
    }
  }
  local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Draw XFB have passed.",0x15)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00865c2d:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFB::iterate(void)
{
	/* Initializations. */
	bool is_at_least_gl_40 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_arb_tf_2	   = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback2");

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if (is_at_least_gl_40 || is_arb_tf_2)
		{
			for (glw::GLuint i = 0; (i < s_capture_modes_count) && is_ok; ++i)
			{
				prepare(s_capture_modes[i]);

				bindVAO(m_vao_id);
				useProgram(m_program_id_xfb);

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					bindBOForXFB(s_capture_modes[i], m_bo_id[j]);
					useColour(m_program_id_xfb, s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
					useGeometrySet(m_program_id_xfb, false);
					drawForCapture(true, true, false, false);

					is_ok = is_ok && inspectXFBState(true, true);
				}

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					useColour(m_program_id_xfb, s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
					useGeometrySet(m_program_id_xfb, true);
					drawForCapture(false, false, true, true);

					is_ok = is_ok && inspectXFBState(false, false);
				}

				useProgram(m_program_id_draw);

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					bindBOForDraw(m_program_id_draw, s_capture_modes[i], m_bo_id[j]);
					drawToFramebuffer(m_xfb_id[j]);

					is_ok =
						is_ok && checkFramebuffer(s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
				}

				clean();
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
		clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}